

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O3

int __thiscall glcts::FBOSentry::init(FBOSentry *this,EVP_PKEY_CTX *ctx)

{
  GLenum GVar1;
  GLenum GVar2;
  int iVar3;
  TestError *this_00;
  GLenum in_ECX;
  GLsizei in_EDX;
  GLsizei GVar4;
  GLenum in_R8D;
  
  (*this->m_gl->genFramebuffers)(1,&this->m_fbo);
  (*this->m_gl->bindFramebuffer)(0x8d40,this->m_fbo);
  (*this->m_gl->genRenderbuffers)(2,this->m_rbo);
  (*this->m_gl->bindRenderbuffer)(0x8d41,this->m_rbo[0]);
  GVar4 = (GLsizei)ctx;
  (*this->m_gl->renderbufferStorage)(0x8d41,in_ECX,GVar4,in_EDX);
  (*this->m_gl->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,this->m_rbo[0]);
  if (in_R8D != 0) {
    (*this->m_gl->bindRenderbuffer)(0x8d41,this->m_rbo[1]);
    (*this->m_gl->renderbufferStorage)(0x8d41,in_R8D,GVar4,in_EDX);
    (*this->m_gl->framebufferRenderbuffer)(0x8d40,0x8ce1,0x8d41,this->m_rbo[1]);
  }
  GVar1 = (*this->m_gl->checkFramebufferStatus)(0x8d40);
  GVar2 = (*this->m_gl->getError)();
  if ((GVar1 == 0x8cd5) && (GVar2 == 0)) {
    (*this->m_gl->viewport)(0,0,GVar4,in_EDX);
    iVar3 = (*this->m_gl->scissor)(0,0,GVar4,in_EDX);
    return iVar3;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Framebuffer failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
             ,0x235);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void FBOSentry::init(int width, int height, glw::GLenum fmt0, glw::GLenum fmt1)
{
	m_gl.genFramebuffers(1, &m_fbo);
	m_gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);

	m_gl.genRenderbuffers(2, m_rbo);
	m_gl.bindRenderbuffer(GL_RENDERBUFFER, m_rbo[0]);
	m_gl.renderbufferStorage(GL_RENDERBUFFER, fmt0, width, height);
	m_gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_rbo[0]);

	if (fmt1 != GL_NONE)
	{
		m_gl.bindRenderbuffer(GL_RENDERBUFFER, m_rbo[1]);
		m_gl.renderbufferStorage(GL_RENDERBUFFER, fmt1, width, height);
		m_gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT1, GL_RENDERBUFFER, m_rbo[1]);
	}

	glw::GLenum status = m_gl.checkFramebufferStatus(GL_FRAMEBUFFER);
	if (m_gl.getError() != GL_NO_ERROR || status != GL_FRAMEBUFFER_COMPLETE)
	{
		TCU_FAIL("Framebuffer failed");
	}

	m_gl.viewport(0, 0, width, height);
	m_gl.scissor(0, 0, width, height);
}